

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_4x2(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  memset(data,0,0x100);
  uVar4 = (ulong)start_col;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 8) {
    lVar5 = *(long *)((long)sample_data + lVar10);
    bVar1 = *(byte *)(lVar5 + 3 + uVar4);
    iVar8 = (uint)*(byte *)(lVar5 + uVar4) + (uint)bVar1;
    bVar2 = *(byte *)(lVar5 + 1 + uVar4);
    bVar3 = *(byte *)(lVar5 + 2 + uVar4);
    iVar9 = (uint)bVar2 + (uint)bVar3;
    lVar6 = (ulong)*(byte *)(lVar5 + uVar4) - (ulong)bVar1;
    lVar5 = (ulong)bVar2 - (ulong)bVar3;
    data[lVar10] = (iVar9 + iVar8) * 0x20 + -0x4000;
    data[lVar10 + 2] = (iVar8 - iVar9) * 0x20;
    lVar7 = (lVar5 + lVar6) * 0x1151;
    data[lVar10 + 1] = (DCTELEM)((ulong)(lVar6 * 0x187e + lVar7 + 0x80) >> 8);
    data[lVar10 + 3] = (DCTELEM)((ulong)(lVar5 * 0xffffffc4df + lVar7 + 0x80) >> 8);
  }
  for (lVar10 = 0; (int)lVar10 != 4; lVar10 = lVar10 + 1) {
    iVar8 = data[lVar10];
    data[lVar10] = (DCTELEM)((long)iVar8 + (long)data[lVar10 + 8] + 2U >> 2);
    data[lVar10 + 8] = (DCTELEM)((ulong)(((long)iVar8 + 2) - (long)data[lVar10 + 8]) >> 2);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_4x2 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by (8/4)*(8/2) = 2**3, which we add here. */
  /* 4-point FDCT kernel, */
  /* cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT]. */

  dataptr = data;
  for (ctr = 0; ctr < 2; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[3]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[2]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[3]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 4 * CENTERJSAMPLE) << (PASS1_BITS+3));
    dataptr[2] = (DCTELEM) ((tmp0 - tmp1) << (PASS1_BITS+3));

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-4);

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS-PASS1_BITS-3);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS-PASS1_BITS-3);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = dataptr[DCTSIZE*0] + (ONE << (PASS1_BITS-1));
    tmp1 = dataptr[DCTSIZE*1];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp0 + tmp1, PASS1_BITS);

    /* Odd part */

    dataptr[DCTSIZE*1] = (DCTELEM) RIGHT_SHIFT(tmp0 - tmp1, PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}